

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

_Bool al_wait_for_vsync(void)

{
  _func__Bool_ALLEGRO_DISPLAY_ptr *UNRECOVERED_JUMPTABLE;
  _Bool _Var1;
  ALLEGRO_DISPLAY *pAVar2;
  
  pAVar2 = al_get_current_display();
  UNRECOVERED_JUMPTABLE = pAVar2->vt->wait_for_vsync;
  if (UNRECOVERED_JUMPTABLE != (_func__Bool_ALLEGRO_DISPLAY_ptr *)0x0) {
    _Var1 = (*UNRECOVERED_JUMPTABLE)(pAVar2);
    return _Var1;
  }
  return false;
}

Assistant:

bool al_wait_for_vsync(void)
{
   ALLEGRO_DISPLAY *display = al_get_current_display();
   ASSERT(display);

   if (display->vt->wait_for_vsync)
      return display->vt->wait_for_vsync(display);
   else
      return false;
}